

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instance.cpp
# Opt level: O0

void __thiscall myvk::Instance::~Instance(Instance *this)

{
  Instance *in_RDI;
  
  ~Instance(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

Instance::~Instance() {
	if (m_instance) {
		if (m_debug_messenger)
			vkDestroyDebugUtilsMessengerEXT(m_instance, m_debug_messenger, nullptr);
		vkDestroyInstance(m_instance, nullptr);
	}
}